

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstrumentPass::InstProcessEntryPointCallTree
          (InstrumentPass *this,InstProcessFunction *pfn)

{
  bool bVar1;
  IRContext *this_00;
  MessageConsumer *pMVar2;
  char *__args_3;
  uint32_t local_ec;
  bool modified;
  Instruction *pIStack_e8;
  Instruction *e;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  allocator<char> local_49;
  string local_48 [8];
  string message;
  ExecutionModel stage;
  uint32_t stage_id;
  InstProcessFunction *pfn_local;
  InstrumentPass *this_local;
  
  if ((this->use_stage_info_ & 1U) == 0) {
    message.field_2._12_4_ = 0;
  }
  else {
    this_00 = Pass::context(&this->super_Pass);
    message.field_2._8_4_ = IRContext::GetStage(this_00);
    message.field_2._12_4_ = message.field_2._8_4_;
    if (((((message.field_2._8_4_ != Vertex) && (message.field_2._8_4_ != Fragment)) &&
         (message.field_2._8_4_ != Geometry)) &&
        (((message.field_2._8_4_ != GLCompute && (message.field_2._8_4_ != TessellationControl)) &&
         ((message.field_2._8_4_ != TessellationEvaluation &&
          ((message.field_2._8_4_ != TaskNV && (message.field_2._8_4_ != MeshNV)))))))) &&
       ((message.field_2._8_4_ != RayGenerationKHR &&
        (((((message.field_2._8_4_ != IntersectionKHR && (message.field_2._8_4_ != AnyHitKHR)) &&
           (message.field_2._8_4_ != ClosestHitKHR)) &&
          ((message.field_2._8_4_ != MissKHR && (message.field_2._8_4_ != CallableKHR)))) &&
         ((message.field_2._8_4_ != TaskEXT && (message.field_2._8_4_ != MeshEXT)))))))) {
      pMVar2 = Pass::consumer(&this->super_Pass);
      bVar1 = std::function::operator_cast_to_bool((function *)pMVar2);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_48,"Stage not supported by instrumentation",&local_49);
        std::allocator<char>::~allocator(&local_49);
        pMVar2 = Pass::consumer(&this->super_Pass);
        memset(&roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,0,0x18);
        __args_3 = (char *)std::__cxx11::string::c_str();
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(pMVar2,SPV_MSG_ERROR,(char *)0x0,
                   (spv_position_t *)
                   &roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,__args_3);
        std::__cxx11::string::~string(local_48);
      }
      return false;
    }
  }
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)&__range2)
  ;
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&e);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&e), bVar1) {
    pIStack_e8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    local_ec = Instruction::GetSingleWordInOperand(pIStack_e8,1);
    std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &__range2,&local_ec);
    InstructionList::iterator::operator++(&__end2);
  }
  bVar1 = InstProcessCallTreeFromRoots
                    (this,pfn,(queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&__range2,message.field_2._12_4_);
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &__range2);
  return bVar1;
}

Assistant:

bool InstrumentPass::InstProcessEntryPointCallTree(InstProcessFunction& pfn) {
  uint32_t stage_id;
  if (use_stage_info_) {
    // Make sure all entry points have the same execution model. Do not
    // instrument if they do not.
    // TODO(greg-lunarg): Handle mixed stages. Technically, a shader module
    // can contain entry points with different execution models, although
    // such modules will likely be rare as GLSL and HLSL are geared toward
    // one model per module. In such cases we will need
    // to clone any functions which are in the call trees of entrypoints
    // with differing execution models.
    spv::ExecutionModel stage = context()->GetStage();
    // Check for supported stages
    if (stage != spv::ExecutionModel::Vertex &&
        stage != spv::ExecutionModel::Fragment &&
        stage != spv::ExecutionModel::Geometry &&
        stage != spv::ExecutionModel::GLCompute &&
        stage != spv::ExecutionModel::TessellationControl &&
        stage != spv::ExecutionModel::TessellationEvaluation &&
        stage != spv::ExecutionModel::TaskNV &&
        stage != spv::ExecutionModel::MeshNV &&
        stage != spv::ExecutionModel::RayGenerationNV &&
        stage != spv::ExecutionModel::IntersectionNV &&
        stage != spv::ExecutionModel::AnyHitNV &&
        stage != spv::ExecutionModel::ClosestHitNV &&
        stage != spv::ExecutionModel::MissNV &&
        stage != spv::ExecutionModel::CallableNV &&
        stage != spv::ExecutionModel::TaskEXT &&
        stage != spv::ExecutionModel::MeshEXT) {
      if (consumer()) {
        std::string message = "Stage not supported by instrumentation";
        consumer()(SPV_MSG_ERROR, 0, {0, 0, 0}, message.c_str());
      }
      return false;
    }
    stage_id = static_cast<uint32_t>(stage);
  } else {
    stage_id = 0;
  }
  // Add together the roots of all entry points
  std::queue<uint32_t> roots;
  for (auto& e : get_module()->entry_points()) {
    roots.push(e.GetSingleWordInOperand(kEntryPointFunctionIdInIdx));
  }
  bool modified = InstProcessCallTreeFromRoots(pfn, &roots, stage_id);
  return modified;
}